

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gluVarType.hpp
# Opt level: O3

void __thiscall
glu::decl::DeclareVariable::DeclareVariable
          (DeclareVariable *this,VarType *varType_,string *name_,int indentLevel_)

{
  pointer pcVar1;
  
  VarType::VarType(&this->varType,varType_);
  (this->name)._M_dataplus._M_p = (pointer)&(this->name).field_2;
  pcVar1 = (name_->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&this->name,pcVar1,pcVar1 + name_->_M_string_length);
  this->indentLevel = indentLevel_;
  return;
}

Assistant:

DeclareVariable (const VarType& varType_, const std::string& name_, int indentLevel_) : varType(varType_), name(name_), indentLevel(indentLevel_) {}